

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineDepthTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::pipeline::anon_unknown_0::DepthTestInstance::verifyImage
          (TestStatus *__return_storage_ptr__,DepthTestInstance *this)

{
  undefined4 queueFamilyIndex_00;
  uint surfaceWidth;
  uint surfaceHeight;
  DeviceInterface *vk_00;
  VkDevice device;
  VkQueue queue_00;
  InstanceInterface *vk_01;
  VkPhysicalDevice physicalDevice;
  Handle<(vk::HandleType)9> *pHVar1;
  TestContext *this_00;
  TestLog *log;
  TextureLevel *this_01;
  allocator<char> local_7e1;
  string local_7e0;
  undefined4 local_7c0;
  allocator<char> local_7b9;
  string local_7b8;
  Vector<int,_3> local_794;
  Vector<unsigned_int,_4> local_788;
  ConstPixelBufferAccess local_778;
  ConstPixelBufferAccess local_750;
  deUint64 local_728;
  undefined1 local_720 [8];
  MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> result;
  undefined1 local_508 [8];
  SimpleAllocator allocator;
  deUint32 queueFamilyIndex;
  VkQueue queue;
  VkDevice vkDevice;
  DeviceInterface *vk;
  __normal_iterator<vkt::pipeline::Vertex4RGBA_*,_std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>_>
  local_2c0;
  __normal_iterator<vkt::pipeline::Vertex4RGBA_*,_std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>_>
  local_2b8;
  __normal_iterator<vkt::pipeline::Vertex4RGBA_*,_std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>_>
  local_2b0;
  __normal_iterator<vkt::pipeline::Vertex4RGBA_*,_std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>_>
  local_2a8;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> local_2a0;
  ViewportState local_284;
  undefined1 local_26c [8];
  RenderState renderState;
  int quadNdx;
  bool compareOk;
  ReferenceRenderer refRenderer;
  Program program;
  undefined1 local_a8 [8];
  ColorFragmentShader fragmentShader;
  ColorVertexShader vertexShader;
  TextureFormat tcuDepthFormat;
  TextureFormat tcuColorFormat;
  DepthTestInstance *this_local;
  
  tcuDepthFormat = ::vk::mapVkFormat(this->m_colorFormat);
  vertexShader.super_VertexShader.m_outputs.
  super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)::vk::mapVkFormat(this->m_depthFormat);
  ColorVertexShader::ColorVertexShader((ColorVertexShader *)&fragmentShader.m_depthStencilFormat);
  ColorFragmentShader::ColorFragmentShader
            ((ColorFragmentShader *)local_a8,&tcuDepthFormat,
             (TextureFormat *)
             &vertexShader.super_VertexShader.m_outputs.
              super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  rr::Program::Program
            ((Program *)&refRenderer.m_program,(VertexShader *)&fragmentShader.m_depthStencilFormat,
             (FragmentShader *)local_a8,(GeometryShader *)0x0);
  surfaceWidth = tcu::Vector<unsigned_int,_2>::x(&this->m_renderSize);
  surfaceHeight = tcu::Vector<unsigned_int,_2>::y(&this->m_renderSize);
  ReferenceRenderer::ReferenceRenderer
            ((ReferenceRenderer *)&quadNdx,surfaceWidth,surfaceHeight,1,&tcuDepthFormat,
             (TextureFormat *)
             &vertexShader.super_VertexShader.m_outputs.
              super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(Program *)&refRenderer.m_program);
  renderState.viewportOrientation._3_1_ = VIEWPORTORIENTATION_LOWER_LEFT >> 0x18;
  for (renderState.restart.restartIndex = 0; (int)renderState.restart.restartIndex < 4;
      renderState.restart.restartIndex = renderState.restart.restartIndex + 1) {
    ReferenceRenderer::getViewportState(&local_284,(ReferenceRenderer *)&quadNdx);
    rr::RenderState::RenderState((RenderState *)local_26c,&local_284,VIEWPORTORIENTATION_LOWER_LEFT)
    ;
    renderState.fragOps.stencilStates[1].dpPass._0_1_ = STENCILOP_ZERO;
    renderState.fragOps.stencilStates[1].writeMask =
         mapVkCompareOp(this->m_depthCompareOps[(int)renderState.restart.restartIndex]);
    local_2b0._M_current =
         (Vertex4RGBA *)
         std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::begin
                   (&this->m_vertices);
    local_2a8 = __gnu_cxx::
                __normal_iterator<vkt::pipeline::Vertex4RGBA_*,_std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>_>
                ::operator+(&local_2b0,(long)(int)(renderState.restart.restartIndex * 6));
    local_2c0._M_current =
         (Vertex4RGBA *)
         std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::begin
                   (&this->m_vertices);
    local_2b8 = __gnu_cxx::
                __normal_iterator<vkt::pipeline::Vertex4RGBA_*,_std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>_>
                ::operator+(&local_2c0,(long)(int)(renderState.restart.restartIndex * 6 + 6));
    std::allocator<vkt::pipeline::Vertex4RGBA>::allocator
              ((allocator<vkt::pipeline::Vertex4RGBA> *)((long)&vk + 7));
    std::vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>>::
    vector<__gnu_cxx::__normal_iterator<vkt::pipeline::Vertex4RGBA*,std::vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>>>,void>
              ((vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>> *)
               &local_2a0,local_2a8,local_2b8,
               (allocator<vkt::pipeline::Vertex4RGBA> *)((long)&vk + 7));
    ReferenceRenderer::draw
              ((ReferenceRenderer *)&quadNdx,(RenderState *)local_26c,PRIMITIVETYPE_TRIANGLES,
               &local_2a0);
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::~vector
              (&local_2a0);
    std::allocator<vkt::pipeline::Vertex4RGBA>::~allocator
              ((allocator<vkt::pipeline::Vertex4RGBA> *)((long)&vk + 7));
  }
  vk_00 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  queue_00 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  allocator.m_memProps.memoryHeaps[0xf]._12_4_ =
       Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  vk_01 = Context::getInstanceInterface((this->super_TestInstance).m_context);
  physicalDevice = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  ::vk::getPhysicalDeviceMemoryProperties
            ((VkPhysicalDeviceMemoryProperties *)
             &result.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.
              m_data.field_0x8,vk_01,physicalDevice);
  ::vk::SimpleAllocator::SimpleAllocator
            ((SimpleAllocator *)local_508,vk_00,device,
             (VkPhysicalDeviceMemoryProperties *)
             &result.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.
              m_data.field_0x8);
  queueFamilyIndex_00 = allocator.m_memProps.memoryHeaps[0xf]._12_4_;
  pHVar1 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                     (&(this->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  local_728 = pHVar1->m_internal;
  readColorAttachment((MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)
                      local_720,vk_00,device,queue_00,queueFamilyIndex_00,(Allocator *)local_508,
                      (VkImage)local_728,this->m_colorFormat,&this->m_renderSize);
  this_00 = Context::getTestContext((this->super_TestInstance).m_context);
  log = tcu::TestContext::getLog(this_00);
  ReferenceRenderer::getAccess((PixelBufferAccess *)&local_750,(ReferenceRenderer *)&quadNdx);
  this_01 = de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::
            operator->((UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)
                       local_720);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_778,this_01);
  tcu::Vector<unsigned_int,_4>::Vector(&local_788,2,2,2,2);
  tcu::Vector<int,_3>::Vector(&local_794,1,1,0);
  renderState.viewportOrientation._3_1_ =
       tcu::intThresholdPositionDeviationCompare
                 (log,"IntImageCompare","Image comparison",&local_750,&local_778,&local_788,
                  &local_794,true,COMPARE_LOG_RESULT);
  de::details::MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::~MovePtr
            ((MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)local_720);
  ::vk::SimpleAllocator::~SimpleAllocator((SimpleAllocator *)local_508);
  if ((renderState.viewportOrientation._3_1_ & 1) == VIEWPORTORIENTATION_LOWER_LEFT >> 0x18) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7e0,"Image mismatch",&local_7e1);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_7e0);
    std::__cxx11::string::~string((string *)&local_7e0);
    std::allocator<char>::~allocator(&local_7e1);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7b8,"Result image matches reference",&local_7b9);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_7b8);
    std::__cxx11::string::~string((string *)&local_7b8);
    std::allocator<char>::~allocator(&local_7b9);
  }
  local_7c0 = 1;
  ReferenceRenderer::~ReferenceRenderer((ReferenceRenderer *)&quadNdx);
  ColorFragmentShader::~ColorFragmentShader((ColorFragmentShader *)local_a8);
  ColorVertexShader::~ColorVertexShader((ColorVertexShader *)&fragmentShader.m_depthStencilFormat);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus DepthTestInstance::verifyImage (void)
{
	const tcu::TextureFormat	tcuColorFormat	= mapVkFormat(m_colorFormat);
	const tcu::TextureFormat	tcuDepthFormat	= mapVkFormat(m_depthFormat);
	const ColorVertexShader		vertexShader;
	const ColorFragmentShader	fragmentShader	(tcuColorFormat, tcuDepthFormat);
	const rr::Program			program			(&vertexShader, &fragmentShader);
	ReferenceRenderer			refRenderer		(m_renderSize.x(), m_renderSize.y(), 1, tcuColorFormat, tcuDepthFormat, &program);
	bool						compareOk		= false;

	// Render reference image
	{
		for (int quadNdx = 0; quadNdx < DepthTest::QUAD_COUNT; quadNdx++)
		{
			// Set depth state
			rr::RenderState renderState(refRenderer.getViewportState());
			renderState.fragOps.depthTestEnabled = true;
			renderState.fragOps.depthFunc = mapVkCompareOp(m_depthCompareOps[quadNdx]);

			refRenderer.draw(renderState,
							 rr::PRIMITIVETYPE_TRIANGLES,
							 std::vector<Vertex4RGBA>(m_vertices.begin() + quadNdx * 6,
													  m_vertices.begin() + (quadNdx + 1) * 6));
		}
	}

	// Compare result with reference image
	{
		const DeviceInterface&			vk					= m_context.getDeviceInterface();
		const VkDevice					vkDevice			= m_context.getDevice();
		const VkQueue					queue				= m_context.getUniversalQueue();
		const deUint32					queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
		SimpleAllocator					allocator			(vk, vkDevice, getPhysicalDeviceMemoryProperties(m_context.getInstanceInterface(), m_context.getPhysicalDevice()));
		de::MovePtr<tcu::TextureLevel>	result				= readColorAttachment(vk, vkDevice, queue, queueFamilyIndex, allocator, *m_colorImage, m_colorFormat, m_renderSize);

		compareOk = tcu::intThresholdPositionDeviationCompare(m_context.getTestContext().getLog(),
															  "IntImageCompare",
															  "Image comparison",
															  refRenderer.getAccess(),
															  result->getAccess(),
															  tcu::UVec4(2, 2, 2, 2),
															  tcu::IVec3(1, 1, 0),
															  true,
															  tcu::COMPARE_LOG_RESULT);
	}

	if (compareOk)
		return tcu::TestStatus::pass("Result image matches reference");
	else
		return tcu::TestStatus::fail("Image mismatch");
}